

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl.cpp
# Opt level: O2

void __thiscall arbiter::http::Curl::~Curl(Curl *this)

{
  curl_easy_cleanup(this->m_curl);
  curl_slist_free_all(this->m_headers);
  this->m_headers = (curl_slist *)0x0;
  ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->m_data).super__Vector_base<char,_std::allocator<char>_>);
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&this->m_proxy);
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&this->m_caInfo);
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&this->m_caPath);
  return;
}

Assistant:

Curl::~Curl()
{
#ifdef ARBITER_CURL
    curl_easy_cleanup(m_curl);
    curl_slist_free_all(m_headers);
    m_headers = nullptr;
#endif
}